

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_request.hpp
# Opt level: O3

string_view __thiscall
cinatra::coro_http_request::get_header_value(coro_http_request *this,string_view key)

{
  char cVar1;
  http_parser *phVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  difference_type __d1;
  array<cinatra::http_header,_100UL> *paVar8;
  size_t sVar9;
  string_view sVar10;
  difference_type __d2;
  
  phVar2 = this->parser_;
  sVar6 = phVar2->num_headers_;
  if (sVar6 == 0) {
    pcVar7 = (char *)0x0;
    sVar6 = 0;
  }
  else {
    paVar8 = &phVar2->headers_;
    do {
      sVar3 = paVar8->_M_elems[0].name._M_len;
      if (sVar3 == key._M_len) {
        if (key._M_len == 0) {
LAB_001586dc:
          sVar6 = paVar8->_M_elems[0].value._M_len;
          pcVar7 = paVar8->_M_elems[0].value._M_str;
          goto LAB_001586ea;
        }
        pcVar7 = paVar8->_M_elems[0].name._M_str;
        sVar9 = 0;
        while( true ) {
          cVar1 = key._M_str[sVar9];
          iVar4 = tolower((int)pcVar7[sVar9]);
          iVar5 = tolower((int)cVar1);
          if (iVar4 != iVar5) break;
          sVar9 = sVar9 + 1;
          if (sVar3 == sVar9) goto LAB_001586dc;
        }
      }
      paVar8 = (array<cinatra::http_header,_100UL> *)(paVar8->_M_elems + 1);
    } while ((http_header *)paVar8 != (phVar2->headers_)._M_elems + sVar6);
    sVar6 = 0;
    pcVar7 = (char *)0x0;
  }
LAB_001586ea:
  sVar10._M_str = pcVar7;
  sVar10._M_len = sVar6;
  return sVar10;
}

Assistant:

std::string_view get_header_value(std::string_view key) {
    auto headers = parser_.get_headers();
    for (auto &header : headers) {
      if (iequal0(header.name, key)) {
        return header.value;
      }
    }

    return {};
  }